

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_uwsgi_module.c
# Opt level: O3

char * ngx_http_uwsgi_cache(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  byte bVar1;
  void *pvVar2;
  int iVar3;
  ngx_int_t nVar4;
  size_t *psVar5;
  ngx_shm_zone_t *pnVar6;
  ngx_str_t *name;
  ngx_http_compile_complex_value_t local_70;
  undefined1 auStack_50 [8];
  ngx_http_complex_value_t cv;
  
  bVar1 = *(byte *)((long)conf + 0x1a0);
  if ((~bVar1 & 3) != 0) {
    return "is duplicate";
  }
  pvVar2 = cf->args->elts;
  iVar3 = strcmp(*(char **)((long)pvVar2 + 0x18),"off");
  if (iVar3 == 0) {
    *(byte *)((long)conf + 0x1a0) = bVar1 & 0xfc;
  }
  else {
    if ('?' < (char)(bVar1 * '\x10')) {
      return "is incompatible with \"uwsgi_store\"";
    }
    name = (ngx_str_t *)((long)pvVar2 + 0x10);
    *(byte *)((long)conf + 0x1a0) = bVar1 & 0xfd;
    local_70._24_8_ = 0;
    local_70.complex_value = (ngx_http_complex_value_t *)auStack_50;
    local_70.cf = cf;
    local_70.value = name;
    nVar4 = ngx_http_compile_complex_value(&local_70);
    if (nVar4 != 0) {
      return (char *)0xffffffffffffffff;
    }
    if (cv.flushes == (ngx_uint_t *)0x0) {
      pnVar6 = ngx_shared_memory_add(cf,name,0,&ngx_http_uwsgi_module);
      *(ngx_shm_zone_t **)((long)conf + 0x110) = pnVar6;
      return (char *)-(ulong)(pnVar6 == (ngx_shm_zone_t *)0x0);
    }
    psVar5 = (size_t *)ngx_palloc(cf->pool,0x28);
    *(size_t **)((long)conf + 0x118) = psVar5;
    if (psVar5 == (size_t *)0x0) {
      return (char *)0xffffffffffffffff;
    }
    psVar5[4] = (size_t)cv.lengths;
    psVar5[2] = (size_t)cv.value.data;
    psVar5[3] = (size_t)cv.flushes;
    *psVar5 = (size_t)auStack_50;
    psVar5[1] = cv.value.len;
  }
  return (char *)0x0;
}

Assistant:

static char *
ngx_http_uwsgi_cache(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_uwsgi_loc_conf_t *uwcf = conf;

    ngx_str_t                         *value;
    ngx_http_complex_value_t           cv;
    ngx_http_compile_complex_value_t   ccv;

    value = cf->args->elts;

    if (uwcf->upstream.cache != NGX_CONF_UNSET) {
        return "is duplicate";
    }

    if (ngx_strcmp(value[1].data, "off") == 0) {
        uwcf->upstream.cache = 0;
        return NGX_CONF_OK;
    }

    if (uwcf->upstream.store > 0) {
        return "is incompatible with \"uwsgi_store\"";
    }

    uwcf->upstream.cache = 1;

    ngx_memzero(&ccv, sizeof(ngx_http_compile_complex_value_t));

    ccv.cf = cf;
    ccv.value = &value[1];
    ccv.complex_value = &cv;

    if (ngx_http_compile_complex_value(&ccv) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    if (cv.lengths != NULL) {

        uwcf->upstream.cache_value = ngx_palloc(cf->pool,
                                             sizeof(ngx_http_complex_value_t));
        if (uwcf->upstream.cache_value == NULL) {
            return NGX_CONF_ERROR;
        }

        *uwcf->upstream.cache_value = cv;

        return NGX_CONF_OK;
    }

    uwcf->upstream.cache_zone = ngx_shared_memory_add(cf, &value[1], 0,
                                                      &ngx_http_uwsgi_module);
    if (uwcf->upstream.cache_zone == NULL) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}